

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.cpp
# Opt level: O3

string * __thiscall helics::PublicationInfo::getTargets_abi_cxx11_(PublicationInfo *this)

{
  string *this_00;
  pointer pSVar1;
  pointer pSVar2;
  string_t local_60;
  data local_40;
  
  this_00 = &this->destTargets;
  if ((this->destTargets)._M_string_length == 0) {
    pSVar2 = (this->subscribers).
             super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar1 = (this->subscribers).
             super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar2 != pSVar1) {
      if ((long)pSVar1 - (long)pSVar2 == 0x28) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pSVar2->key)
        ;
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,'[');
        pSVar2 = (this->subscribers).
                 super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar1 = (this->subscribers).
                 super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pSVar2 != pSVar1) {
          do {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_40,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pSVar2->key);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::dump(&local_60,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_40,-1,' ',true,hex);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_40);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                      local_60._M_dataplus._M_p,local_60._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                      ',');
            pSVar2 = pSVar2 + 1;
          } while (pSVar2 != pSVar1);
        }
        (this->destTargets)._M_dataplus._M_p[(this->destTargets)._M_string_length - 1] = ']';
      }
    }
  }
  return this_00;
}

Assistant:

const std::string& PublicationInfo::getTargets() const
{
    if (destTargets.empty()) {
        if (!subscribers.empty()) {
            if (subscribers.size() == 1) {
                destTargets = subscribers.front().key;
            } else {
                destTargets.push_back('[');
                for (const auto& sub : subscribers) {
                    destTargets.append(generateJsonQuotedString(sub.key));
                    destTargets.push_back(',');
                }
                destTargets.back() = ']';
            }
        }
    }
    return destTargets;
}